

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_30::NetworkAddressImpl::clone
          (NetworkAddressImpl *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SocketAddress *pSVar1;
  size_t sVar2;
  LowLevelAsyncIoProvider *pLVar3;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content;
  Array<kj::(anonymous_namespace)::SocketAddress> local_78;
  _func_int **local_58;
  _func_int **pp_Stack_50;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl> local_48;
  Array<kj::(anonymous_namespace)::SocketAddress> local_38;
  
  local_58 = *(_func_int ***)(__fn + 8);
  pp_Stack_50 = *(_func_int ***)(__fn + 0x10);
  content.size_ = ___flags;
  content.ptr = *(SocketAddress **)(__fn + 0x20);
  heapArray<kj::(anonymous_namespace)::SocketAddress>(&local_78,*(kj **)(__fn + 0x18),content);
  pLVar3 = (LowLevelAsyncIoProvider *)operator_new(0x38);
  sVar2 = local_78.size_;
  pSVar1 = local_78.ptr;
  local_38.disposer = local_78.disposer;
  local_78.ptr = (SocketAddress *)0x0;
  local_78.size_ = 0;
  pLVar3->_vptr_LowLevelAsyncIoProvider = (_func_int **)&PTR_connect_0067b980;
  pLVar3[1]._vptr_LowLevelAsyncIoProvider = local_58;
  pLVar3[2]._vptr_LowLevelAsyncIoProvider = pp_Stack_50;
  pLVar3[3]._vptr_LowLevelAsyncIoProvider = (_func_int **)pSVar1;
  pLVar3[4]._vptr_LowLevelAsyncIoProvider = (_func_int **)sVar2;
  pLVar3[5]._vptr_LowLevelAsyncIoProvider = (_func_int **)local_78.disposer;
  *(undefined4 *)&pLVar3[6]._vptr_LowLevelAsyncIoProvider = 0;
  local_38.ptr = (SocketAddress *)0x0;
  local_38.size_ = 0;
  local_48.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::instance;
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&local_38);
  (this->super_NetworkAddress)._vptr_NetworkAddress =
       (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressImpl>::instance;
  this->lowLevel = pLVar3;
  local_48.ptr = (NetworkAddressImpl *)0x0;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl>::~Own(&local_48);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&local_78);
  return (int)this;
}

Assistant:

Own<NetworkAddress> clone() override {
    return kj::heap<NetworkAddressImpl>(lowLevel, filter, kj::heapArray(addrs.asPtr()));
  }